

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::Check(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
        *this)

{
  code *pcVar1;
  undefined1 this_00 [8];
  NodeBase *pNVar2;
  bool bVar3;
  uint uVar4;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar5;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar6;
  undefined8 *in_FS_OFFSET;
  undefined1 local_98 [8];
  Iterator decommitSegmentsIterator;
  Iterator emptySegmentsIterator;
  Iterator fullSegmentsIterator;
  Iterator segmentsIterator;
  size_t currentFreePageCount;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  if ((((Js::Configuration::Global[0x2c158] & 1) != 0) && (bVar3 = HasZeroQueuedPages(this), bVar3))
     && ((this->waitingToEnterIdleDecommit & 1U) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x9d5,"(!this->HasZeroQueuedPages() || this->waitingToEnterIdleDecommit)",
                       "!this->HasZeroQueuedPages() || this->waitingToEnterIdleDecommit");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  segmentsIterator.current = (NodeBase *)0x0;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::Iterator::
  Iterator((Iterator *)&fullSegmentsIterator.current,&this->segments);
  while( true ) {
    if (segmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pNVar2 = fullSegmentsIterator.current;
    pDVar5 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                       (&(segmentsIterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                       );
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
            IsHead((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    *)pNVar2,pDVar5);
    if (bVar3) break;
    segmentsIterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                   (&(segmentsIterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                   );
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)&fullSegmentsIterator.current);
    uVar4 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount(pPVar6);
    segmentsIterator.current = (NodeBase *)((long)&(segmentsIterator.current)->next + (ulong)uVar4);
  }
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::Iterator::
  Iterator((Iterator *)&emptySegmentsIterator.current,&this->fullSegments);
  while( true ) {
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pNVar2 = emptySegmentsIterator.current;
    pDVar5 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                       (&(fullSegmentsIterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                       );
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
            IsHead((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    *)pNVar2,pDVar5);
    if (bVar3) break;
    fullSegmentsIterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                   (&(fullSegmentsIterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                   );
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)&emptySegmentsIterator.current);
    uVar4 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount(pPVar6);
    segmentsIterator.current = (NodeBase *)((long)&(segmentsIterator.current)->next + (ulong)uVar4);
  }
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::Iterator::
  Iterator((Iterator *)&decommitSegmentsIterator.current,&this->emptySegments);
  while( true ) {
    if (emptySegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pNVar2 = decommitSegmentsIterator.current;
    pDVar5 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                       (&(emptySegmentsIterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                       );
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
            IsHead((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    *)pNVar2,pDVar5);
    if (bVar3) break;
    emptySegmentsIterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                   (&(emptySegmentsIterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                   );
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)&decommitSegmentsIterator.current);
    uVar4 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount(pPVar6);
    segmentsIterator.current = (NodeBase *)((long)&(segmentsIterator.current)->next + (ulong)uVar4);
  }
  emptySegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::Iterator::
  Iterator((Iterator *)local_98,&this->decommitSegments);
  while( true ) {
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    this_00 = local_98;
    pDVar5 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                       (&(decommitSegmentsIterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                       );
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
            IsHead((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    *)this_00,pDVar5);
    if (bVar3) break;
    decommitSegmentsIterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                   (&(decommitSegmentsIterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                   );
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)local_98);
    uVar4 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount(pPVar6);
    segmentsIterator.current = (NodeBase *)((long)&(segmentsIterator.current)->next + (ulong)uVar4);
  }
  decommitSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0;
  if ((NodeBase *)this->freePageCount != segmentsIterator.current) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x9f2,"(freePageCount == currentFreePageCount)",
                       "freePageCount == currentFreePageCount");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::Check()
{
#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // We may have backed-off from the idle decommit on the background thread.
        Assert(!this->HasZeroQueuedPages() || this->waitingToEnterIdleDecommit);
    }
#endif
    size_t currentFreePageCount = 0;

    typename DListBase<TPageSegment>::Iterator segmentsIterator(&segments);
    while (segmentsIterator.Next())
    {
        currentFreePageCount += segmentsIterator.Data().GetFreePageCount();
    }

    typename DListBase<TPageSegment>::Iterator fullSegmentsIterator(&fullSegments);
    while (fullSegmentsIterator.Next())
    {
        currentFreePageCount += fullSegmentsIterator.Data().GetFreePageCount();
    }

    typename DListBase<TPageSegment>::Iterator emptySegmentsIterator(&emptySegments);
    while (emptySegmentsIterator.Next())
    {
        currentFreePageCount += emptySegmentsIterator.Data().GetFreePageCount();
    }

    typename DListBase<TPageSegment>::Iterator decommitSegmentsIterator(&decommitSegments);
    while (decommitSegmentsIterator.Next())
    {
        currentFreePageCount += decommitSegmentsIterator.Data().GetFreePageCount();
    }

    Assert(freePageCount == currentFreePageCount);
}